

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::ClearFreeMemory(ImDrawList *this)

{
  ImDrawChannel *__s;
  long in_RDI;
  int i;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  int i_00;
  
  ImVector<ImDrawCmd>::clear
            ((ImVector<ImDrawCmd> *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  ImVector<unsigned_short>::clear
            ((ImVector<unsigned_short> *)
             CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  ImVector<ImDrawVert>::clear
            ((ImVector<ImDrawVert> *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  *(undefined4 *)(in_RDI + 0x48) = 0;
  *(undefined8 *)(in_RDI + 0x50) = 0;
  *(undefined8 *)(in_RDI + 0x58) = 0;
  ImVector<ImVec4>::clear
            ((ImVector<ImVec4> *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  ImVector<void_*>::clear
            ((ImVector<void_*> *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  ImVector<ImVec2>::clear
            ((ImVector<ImVec2> *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  *(undefined4 *)(in_RDI + 0x90) = 0;
  *(undefined4 *)(in_RDI + 0x94) = 1;
  for (i_00 = 0; i_00 < *(int *)(in_RDI + 0x98); i_00 = i_00 + 1) {
    if (i_00 == 0) {
      __s = ImVector<ImDrawChannel>::operator[]((ImVector<ImDrawChannel> *)(in_RDI + 0x98),0);
      memset(__s,0,0x20);
    }
    ImVector<ImDrawChannel>::operator[]((ImVector<ImDrawChannel> *)(in_RDI + 0x98),i_00);
    ImVector<ImDrawCmd>::clear((ImVector<ImDrawCmd> *)CONCAT44(i_00,in_stack_fffffffffffffff0));
    ImVector<ImDrawChannel>::operator[]((ImVector<ImDrawChannel> *)(in_RDI + 0x98),i_00);
    ImVector<unsigned_short>::clear
              ((ImVector<unsigned_short> *)CONCAT44(i_00,in_stack_fffffffffffffff0));
  }
  ImVector<ImDrawChannel>::clear
            ((ImVector<ImDrawChannel> *)CONCAT44(i_00,in_stack_fffffffffffffff0));
  return;
}

Assistant:

void ImDrawList::ClearFreeMemory()
{
    CmdBuffer.clear();
    IdxBuffer.clear();
    VtxBuffer.clear();
    _VtxCurrentIdx = 0;
    _VtxWritePtr = NULL;
    _IdxWritePtr = NULL;
    _ClipRectStack.clear();
    _TextureIdStack.clear();
    _Path.clear();
    _ChannelsCurrent = 0;
    _ChannelsCount = 1;
    for (int i = 0; i < _Channels.Size; i++)
    {
        if (i == 0) memset(&_Channels[0], 0, sizeof(_Channels[0]));  // channel 0 is a copy of CmdBuffer/IdxBuffer, don't destruct again
        _Channels[i].CmdBuffer.clear();
        _Channels[i].IdxBuffer.clear();
    }
    _Channels.clear();
}